

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O3

int Bmc_CollapseExpandRound2
              (sat_solver *pSat,Vec_Int_t *vLits,Vec_Int_t *vTemp,int nBTLimit,int fOnOffSetLit)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  vTemp->nSize = 0;
  iVar3 = vLits->nSize;
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      if (vLits->pArray[lVar5] != -1) {
        Vec_IntPush(vTemp,vLits->pArray[lVar5]);
        iVar3 = vLits->nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
    if (0 < vTemp->nSize) {
      if (fOnOffSetLit < 0) {
        iVar3 = sat_solver_minimize_assumptions(pSat,vTemp->pArray,vTemp->nSize,nBTLimit);
        if (vTemp->nSize < iVar3) goto LAB_0058bd1b;
        vTemp->nSize = iVar3;
      }
      else {
        sat_solver_push(pSat,fOnOffSetLit);
        iVar3 = sat_solver_minimize_assumptions(pSat,vTemp->pArray,vTemp->nSize,nBTLimit);
        if (vTemp->nSize < iVar3) {
LAB_0058bd1b:
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        vTemp->nSize = iVar3;
        sat_solver_pop(pSat);
      }
      iVar3 = vLits->nSize;
      if (0 < iVar3) {
        piVar2 = vLits->pArray;
        lVar5 = 0;
        do {
          iVar1 = piVar2[lVar5];
          if (iVar1 != -1) {
            if (0 < (long)vTemp->nSize) {
              lVar4 = 0;
              do {
                if (vTemp->pArray[lVar4] == iVar1) goto LAB_0058bce0;
                lVar4 = lVar4 + 1;
              } while (vTemp->nSize != lVar4);
            }
            piVar2[lVar5] = -1;
            iVar3 = vLits->nSize;
          }
LAB_0058bce0:
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar3);
      }
      return 0;
    }
  }
  __assert_fail("Vec_IntSize(vTemp) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                ,0x16c,
                "int Bmc_CollapseExpandRound2(sat_solver *, Vec_Int_t *, Vec_Int_t *, int, int)");
}

Assistant:

int Bmc_CollapseExpandRound2( sat_solver * pSat, Vec_Int_t * vLits, Vec_Int_t * vTemp, int nBTLimit, int fOnOffSetLit )
{
    // put into new array
    int i, iLit, nLits;
    Vec_IntClear( vTemp );
    Vec_IntForEachEntry( vLits, iLit, i )
        if ( iLit != -1 )
            Vec_IntPush( vTemp, iLit );
    assert( Vec_IntSize(vTemp) > 0 );
    // assume condition literal
    if ( fOnOffSetLit >= 0 )
        sat_solver_push( pSat, fOnOffSetLit );
    // minimize
    nLits = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vTemp), Vec_IntSize(vTemp), nBTLimit );
    Vec_IntShrink( vTemp, nLits );
    // assume conditional literal
    if ( fOnOffSetLit >= 0 )
        sat_solver_pop( pSat );
    // modify output literas
    Vec_IntForEachEntry( vLits, iLit, i )
        if ( iLit != -1 && Vec_IntFind(vTemp, iLit) == -1 )
            Vec_IntWriteEntry( vLits, i, -1 );
    return 0;
}